

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

error_info *
toml::detail::make_syntax_error<toml::detail::repeat_at_least>
          (error_info *__return_storage_ptr__,string *title,repeat_at_least *scanner,location *loc,
          string *suffix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  source_location src;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  region local_180;
  source_location local_118;
  source_location local_a0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"expected ",&local_1e1);
  repeat_at_least::expected_chars_abi_cxx11_((string *)&local_180,scanner,loc);
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_118);
  region::region(&local_180,loc);
  source_location::source_location(&local_118,&local_180);
  region::~region(&local_180);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1c0 + 0x20)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)title);
  source_location::source_location(&local_a0,&local_118);
  local_1c0._0_8_ = local_1c0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
    local_1c0._24_8_ = local_1e0.field_2._8_8_;
  }
  else {
    local_1c0._0_8_ = local_1e0._M_dataplus._M_p;
  }
  local_1c0._8_8_ = local_1e0._M_string_length;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  make_error_info<std::__cxx11::string>
            (__return_storage_ptr__,(toml *)(local_1c0 + 0x20),(string *)&local_a0,
             (source_location *)local_1c0,suffix,in_R9);
  std::__cxx11::string::~string((string *)local_1c0);
  source_location::~source_location(&local_a0);
  std::__cxx11::string::~string((string *)(local_1c0 + 0x20));
  source_location::~source_location(&local_118);
  std::__cxx11::string::~string((string *)&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

error_info make_syntax_error(std::string title,
        const S& scanner, location loc, std::string suffix = "")
{
    auto msg = std::string("expected ") + scanner.expected_chars(loc);
    auto src = source_location(region(loc));
    return make_error_info(
        std::move(title), std::move(src), std::move(msg), std::move(suffix));
}